

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O3

char string_feeder_next(string_feeder_t *sf)

{
  char cVar1;
  ulong uVar2;
  
  if (sf == (string_feeder_t *)0x0) {
    __assert_fail("sf != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x1e6,"char string_feeder_next(string_feeder_t *)");
  }
  uVar2 = sf->pos;
  if (uVar2 <= sf->len) {
    sf->pos = uVar2 + 1;
    cVar1 = sf->s[uVar2];
    if (cVar1 == '\n') {
      sf->line = sf->line + 1;
      sf->col = 0;
    }
    else {
      sf->col = sf->col + 1;
    }
    return cVar1;
  }
  __assert_fail("sf->pos <= sf->len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                ,0x1e7,"char string_feeder_next(string_feeder_t *)");
}

Assistant:

char string_feeder_next(string_feeder_t *sf)
{
    assert(sf != NULL);
    assert(sf->pos <= sf->len);

    char c = sf->s[sf->pos++];
    if (c == '\n') {
        sf->line++;
        sf->col = 0;
    } else {
        sf->col++;
    }

    return c;
}